

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ast_type_t identifier_type(string *s)

{
  bool bVar1;
  ast_type_t aVar2;
  int iVar3;
  
  if ((identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_,
               "^[-+]?(\\d+\\.\\d*|\\d*\\.\\d+)$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_);
  }
  if ((identifier_type(std::__cxx11::string_const&)::rational_re_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&identifier_type(std::__cxx11::string_const&)::
                                   rational_re_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&identifier_type(std::__cxx11::string_const&)::rational_re_abi_cxx11_,
               "^[-+]?\\d+\\/[-+]?\\d+$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &identifier_type(std::__cxx11::string_const&)::rational_re_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&identifier_type(std::__cxx11::string_const&)::rational_re_abi_cxx11_);
  }
  if ((identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_,"^[-+]?\\d+$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_);
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (s,&identifier_type(std::__cxx11::string_const&)::int_re_abi_cxx11_,0);
  if (bVar1) {
    aVar2 = INT;
  }
  else {
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (s,&identifier_type(std::__cxx11::string_const&)::float_re_abi_cxx11_,0);
    if (bVar1) {
      aVar2 = FLOAT;
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (s,&identifier_type(std::__cxx11::string_const&)::rational_re_abi_cxx11_,0);
      aVar2 = (uint)bVar1 * 2 + NAME;
    }
  }
  return aVar2;
}

Assistant:

ast_type_t identifier_type(const std::string &s)
{
    static const std::regex float_re("^[-+]?(\\d+\\.\\d*|\\d*\\.\\d+)$");
    static const std::regex rational_re("^[-+]?\\d+\\/[-+]?\\d+$");
    static const std::regex int_re("^[-+]?\\d+$");
    if(std::regex_match(s, int_re))
        return ast_type_t::INT;
    if(std::regex_match(s, float_re) || std::regex_match(s, rational_re))
        return ast_type_t::FLOAT;
    return ast_type_t::NAME;
}